

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry *
NscBuildVectorConstant(CNscPStackEntry *px,CNscPStackEntry *py,CNscPStackEntry *pz)

{
  CNscPStackEntry *this;
  float z;
  float local_34;
  float local_30;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  local_30 = 0.0;
  local_34 = 0.0;
  if (px != (CNscPStackEntry *)0x0) {
    local_34 = CNscPStackEntry::GetFloat(px);
    CNwnDoubleLinkList::InsertAfter(&px->m_link,&g_pCtx->m_listEntryFree);
  }
  if (py != (CNscPStackEntry *)0x0) {
    local_30 = CNscPStackEntry::GetFloat(py);
    CNwnDoubleLinkList::InsertAfter(&py->m_link,&g_pCtx->m_listEntryFree);
  }
  if (pz == (CNscPStackEntry *)0x0) {
    z = 0.0;
  }
  else {
    z = CNscPStackEntry::GetFloat(pz);
    CNwnDoubleLinkList::InsertAfter(&pz->m_link,&g_pCtx->m_listEntryFree);
  }
  CNscPStackEntry::PushConstantVector(this,local_34,local_30,z);
  CNscPStackEntry::SetType(this,NscType_Vector);
  return this;
}

Assistant:

YYSTYPE NscBuildVectorConstant (YYSTYPE px, YYSTYPE py, YYSTYPE pz)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// Get the x value
	//

	float x;
	if (px)
	{
		x = px ->GetFloat ();
		g_pCtx ->FreePStackEntry (px);
	}
	else
		x = 0;

	//
	// Get the y value
	//

	float y;
	if (py)
	{
		y = py ->GetFloat ();
		g_pCtx ->FreePStackEntry (py);
	}
	else
		y = 0;

	//
	// Get the z value
	//

	float z;
	if (pz)
	{
		z = pz ->GetFloat ();
		g_pCtx ->FreePStackEntry (pz);
	}
	else
		z = 0;

	//
	// Set the new value
	//

	pOut ->PushConstantVector (x, y, z);
	pOut ->SetType (NscType_Vector);
	return pOut;
}